

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_map.h
# Opt level: O0

void __thiscall cppcms::impl::string_map::add(string_map *this,char *key,char *value)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_> *this_00
  ;
  int iVar4;
  undefined4 *in_RDI;
  iterator iVar5;
  iterator e;
  iterator p;
  vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_> new_data
  ;
  int new_first;
  entry new_entry;
  iterator *in_stack_ffffffffffffff08;
  reference in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  entry *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
  *in_stack_ffffffffffffff30;
  entry *in_stack_ffffffffffffff38;
  vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
  *in_stack_ffffffffffffff40;
  vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_> local_51
  ;
  undefined4 local_34;
  
  entry::entry(in_stack_ffffffffffffff20,
               (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               (char *)in_stack_ffffffffffffff10);
  lVar1 = *(long *)(in_RDI + 2);
  sVar3 = std::
          vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
          ::size((vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
                  *)(in_RDI + 4));
  if (sVar3 <= (ulong)(lVar1 << 1)) {
    local_34 = 0xffffffff;
    sVar3 = std::
            vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
            ::size((vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
                    *)(in_RDI + 4));
    in_stack_ffffffffffffff38 = (entry *)(sVar3 * 2);
    in_stack_ffffffffffffff40 = &local_51;
    std::allocator<cppcms::impl::string_map::entry>::allocator
              ((allocator<cppcms::impl::string_map::entry> *)0x1197f7);
    std::vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>::
    vector(in_stack_ffffffffffffff30,CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
           (allocator_type *)in_stack_ffffffffffffff20);
    std::allocator<cppcms::impl::string_map::entry>::~allocator
              ((allocator<cppcms::impl::string_map::entry> *)0x11981d);
    iVar5 = begin((string_map *)0x119827);
    in_stack_ffffffffffffff30 = iVar5.d;
    iVar5 = end((string_map *)0x119866);
    this_00 = iVar5.d;
    iVar4 = iVar5.current_;
    while( true ) {
      bVar2 = booster::
              iterator_facade<cppcms::impl::string_map::iterator,_cppcms::impl::string_map::entry,_booster::forward_traversal_tag,_cppcms::impl::string_map::entry_&,_long>
              ::operator!=((iterator_facade<cppcms::impl::string_map::iterator,_cppcms::impl::string_map::entry,_booster::forward_traversal_tag,_cppcms::impl::string_map::entry_&,_long>
                            *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      in_stack_ffffffffffffff18 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff18);
      if (!bVar2) break;
      in_stack_ffffffffffffff10 =
           booster::
           iterator_facade<cppcms::impl::string_map::iterator,_cppcms::impl::string_map::entry,_booster::forward_traversal_tag,_cppcms::impl::string_map::entry_&,_long>
           ::operator*((iterator_facade<cppcms::impl::string_map::iterator,_cppcms::impl::string_map::entry,_booster::forward_traversal_tag,_cppcms::impl::string_map::entry_&,_long>
                        *)0x1198c7);
      insert(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,(int *)in_stack_ffffffffffffff30);
      booster::
      iterator_facade<cppcms::impl::string_map::iterator,_cppcms::impl::string_map::entry,_booster::forward_traversal_tag,_cppcms::impl::string_map::entry_&,_long>
      ::operator++((iterator_facade<cppcms::impl::string_map::iterator,_cppcms::impl::string_map::entry,_booster::forward_traversal_tag,_cppcms::impl::string_map::entry_&,_long>
                    *)in_stack_ffffffffffffff10);
    }
    *in_RDI = local_34;
    std::vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>::
    swap(this_00,(vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
                  *)CONCAT44(iVar4,in_stack_ffffffffffffff18));
    std::vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>::
    ~vector(this_00);
  }
  insert(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,(int *)in_stack_ffffffffffffff30);
  *(long *)(in_RDI + 2) = *(long *)(in_RDI + 2) + 1;
  return;
}

Assistant:

void add(char const *key,char const *value) {
				entry new_entry(key,value);
				if(total_ * 2 >= data_.size()) {
					int new_first = -1;
					std::vector<entry> new_data(data_.size()*2);
					for(iterator p = begin(),e = end();p!=e;++p) {
						insert(new_data,*p,new_first);
					}
					first_ = new_first;
					data_.swap(new_data);
				}
				insert(data_,new_entry,first_);
				total_++;
			}